

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O2

void __thiscall Intel_V4L2::~Intel_V4L2(Intel_V4L2 *this)

{
  int iVar1;
  
  (this->super_CameraBase)._vptr_CameraBase = (_func_int **)&PTR__Intel_V4L2_00104d48;
  free(this->m_pV4l2Buffer);
  free(this->m_pBigBuffer);
  if (-1 < this->m_fd) {
    iVar1 = ioctl(this->m_fd,0x40045613,&this->m_bufType);
    if (iVar1 < 0) {
      perror("Intel_V4L2::~Intel_V4L2 : VIDIOC_STREAMOFF : ");
    }
    close(this->m_fd);
  }
  return;
}

Assistant:

Intel_V4L2::~Intel_V4L2 () {
    if (NULL != m_pV4l2Buffer)
        free (m_pV4l2Buffer);
    if (NULL != m_pBigBuffer)
        free (m_pBigBuffer);
    
    if (0 > m_fd) return;

    if (0 > ioctl (m_fd, VIDIOC_STREAMOFF, &m_bufType)) {
        perror ("Intel_V4L2::~Intel_V4L2 : VIDIOC_STREAMOFF : ");
    }

    close (m_fd);
}